

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textreader.hpp
# Opt level: O0

void __thiscall TextReader::parse_bin(TextReader *this)

{
  size_t sVar1;
  size_t sVar2;
  ulong uVar3;
  char *pcVar4;
  bool bVar5;
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  TextReader *local_10;
  TextReader *this_local;
  
  this->current_token_len_ = this->current_token_len_ + 1;
  this->current_token_len_ = this->current_token_len_ + 1;
  local_10 = this;
  while( true ) {
    sVar1 = this->current_token_pos_;
    sVar2 = this->current_token_len_;
    uVar3 = std::__cxx11::string::size();
    bVar5 = false;
    if (sVar1 + sVar2 < uVar3) {
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)&this->current_line_);
      bVar5 = true;
      if (*pcVar4 != '0') {
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)&this->current_line_);
        bVar5 = *pcVar4 == '1';
      }
    }
    if (!bVar5) break;
    this->current_token_len_ = this->current_token_len_ + 1;
  }
  sVar1 = this->current_token_pos_;
  sVar2 = this->current_token_len_;
  uVar3 = std::__cxx11::string::size();
  if ((sVar1 + sVar2 < uVar3) &&
     ((((pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)&this->current_line_),
        '/' < *pcVar4 &&
        (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)&this->current_line_),
        *pcVar4 < ':')) ||
       ((pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)&this->current_line_),
        '@' < *pcVar4 &&
        (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)&this->current_line_),
        *pcVar4 < '[')))) ||
      (((pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)&this->current_line_),
        '`' < *pcVar4 &&
        (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)&this->current_line_),
        *pcVar4 < '{')) ||
       (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)&this->current_line_),
       *pcVar4 == '_')))))) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"Invalid symbol in binary value",&local_31);
    parse_error(this,(string *)local_30);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  else if (this->current_token_len_ == 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_68,"Binary value prefix specified without the value",&local_69);
    parse_error(this,(string *)local_68);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
  }
  return;
}

Assistant:

inline void parse_bin() {
        current_token_len_++;
        current_token_len_++;
        while (current_token_pos_ + current_token_len_ < current_line_.size() &&
               _is_bin_symbol(current_line_[current_token_pos_ + current_token_len_])) {
            current_token_len_++;
        };
        if (current_token_pos_ + current_token_len_ < current_line_.size() &&
            _is_literal_symbol(current_line_[current_token_pos_ + current_token_len_])) {
            parse_error(ERROR_BIN_INVALID_SYMBOL);
        } else if (current_token_len_ == 2) {
            parse_error(ERROR_MISSING_BIN_VALUE);
        };
    }